

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Contact *ct)

{
  ostream *out_00;
  
  std::operator<<(out,(string *)ct);
  if ((ct->work_address)._M_t.super___uniq_ptr_impl<Address,_std::default_delete<Address>_>._M_t.
      super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
      super__Head_base<0UL,_Address_*,_false>._M_head_impl != (Address *)0x0) {
    out_00 = std::operator<<(out,", ");
    operator<<(out_00,(ct->work_address)._M_t.
                      super___uniq_ptr_impl<Address,_std::default_delete<Address>_>._M_t.
                      super__Tuple_impl<0UL,_Address_*,_std::default_delete<Address>_>.
                      super__Head_base<0UL,_Address_*,_false>._M_head_impl);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Contact& ct)
	{
		out << ct.name;
		if(ct.work_address)
		{
			out << ", " << *ct.work_address;
		}

		return out;
	}